

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void gatom_vis(t_gobj *z,_glist *glist,int vis)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  _glist *p_Var4;
  t_symbol *ptVar5;
  int *local_438;
  char *tags [3];
  int y1;
  int x1;
  char buf [1000];
  t_gatom *x;
  int vis_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  text_vis(z,glist,vis);
  if (*(char *)&(z[5].g_pd)->c_name->s_name != '\0') {
    sprintf((char *)&y1,"%lx.l",z);
    if (vis == 0) {
      p_Var4 = glist_getcanvas(glist);
      pdgui_vmess((char *)0x0,"crs",p_Var4,"delete",&y1);
    }
    else {
      local_438 = &y1;
      tags[0] = "label";
      tags[1] = "text";
      gatom_getwherelabel((t_gatom *)z,glist,(int *)((long)tags + 0x14),(int *)(tags + 2));
      p_Var4 = glist_getcanvas(glist);
      ptVar5 = canvas_realizedollar((_glist *)z[3].g_next,(t_symbol *)z[5].g_pd);
      pcVar1 = ptVar5->s_name;
      iVar2 = gatom_fontsize((t_gatom *)z);
      iVar3 = glist_getzoom(glist);
      pdgui_vmess("pdtk_text_new","cS ff s ir",(double)tags[2]._4_4_,(double)(int)tags[2],p_Var4,3,
                  &local_438,pcVar1,iVar2 * iVar3,"black");
    }
  }
  return;
}

Assistant:

static void gatom_vis(t_gobj *z, t_glist *glist, int vis)
{
    t_gatom *x = (t_gatom*)z;
    text_vis(z, glist, vis);
    if (*x->a_label->s_name)
    {
        char buf[MAXPDSTRING];
        sprintf(buf, "%lx.l", x);
        if (vis)
        {
            int x1, y1;
            char *tags[] = {
                buf,
                "label",
                "text"
            };
            gatom_getwherelabel(x, glist, &x1, &y1);
            pdgui_vmess("pdtk_text_new", "cS ff s ir",
                glist_getcanvas(glist),
                3, tags,
                (double)x1, (double)y1,
                canvas_realizedollar(x->a_glist, x->a_label)->s_name,
                gatom_fontsize(x) * glist_getzoom(glist), "black");
        }
        else
            pdgui_vmess(0, "crs", glist_getcanvas(glist), "delete", buf);
    }
}